

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

array_container_t * array_container_from_run(run_container_t *arr)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  int size;
  array_container_t *paVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  size = run_container_cardinality(arr);
  paVar4 = array_container_create_given_capacity(size);
  paVar4->cardinality = 0;
  uVar6 = 0;
  uVar5 = (ulong)(uint)arr->n_runs;
  if (arr->n_runs < 1) {
    uVar5 = uVar6;
  }
  for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    uVar1 = arr->runs[uVar7].value;
    uVar2 = arr->runs[uVar7].length;
    puVar3 = paVar4->array;
    uVar6 = (ulong)(int)uVar6;
    for (uVar8 = (uint)uVar1; uVar8 <= (uint)uVar2 + (uint)uVar1; uVar8 = uVar8 + 1) {
      puVar3[uVar6] = (uint16_t)uVar8;
      uVar6 = uVar6 + 1;
    }
    paVar4->cardinality = (int32_t)uVar6;
  }
  return paVar4;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}